

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O1

ChQuaternion<double> *
chrono::Angle_to_Quat
          (ChQuaternion<double> *__return_storage_ptr__,AngleSet angset,ChVector<double> *mangles)

{
  undefined1 auVar1 [16];
  char cVar2;
  undefined1 auVar3 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar7;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar8;
  undefined1 auVar17 [64];
  ulong extraout_XMM0_Qb;
  undefined1 auVar18 [64];
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar19 [64];
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  double dVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 in_ZMM6 [64];
  double dVar61;
  double dVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  double in_XMM9_Qa;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  double dVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  double dVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  auVar59 = in_ZMM6._0_16_;
  auVar52 = in_ZMM5._0_16_;
  auVar23 = in_ZMM1._0_16_;
  auVar3 = in_ZMM2._0_16_;
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  __return_storage_ptr__->m_data[2] = 0.0;
  __return_storage_ptr__->m_data[3] = 0.0;
  switch(angset) {
  case EULERO:
    dVar7 = cos(mangles->m_data[0]);
    in_XMM9_Qa = cos(mangles->m_data[1]);
    dVar5 = cos(mangles->m_data[2]);
    dVar6 = sin(mangles->m_data[0]);
    dVar44 = sin(mangles->m_data[1]);
    auVar17._0_8_ = sin(mangles->m_data[2]);
    auVar17._8_56_ = extraout_var;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = dVar6;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = dVar7;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = dVar5;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = dVar6 * -in_XMM9_Qa * auVar17._0_8_;
    auVar52 = vfmadd231sd_fma(auVar36,auVar63,auVar49);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = dVar5 * dVar6 * -in_XMM9_Qa;
    auVar3 = vfnmadd231sd_fma(auVar21,auVar17._0_16_,auVar49);
    auVar23 = vunpcklpd_avx(auVar52,auVar3);
    auVar50._8_8_ = 0;
    auVar50._0_8_ = in_XMM9_Qa * dVar7 * auVar17._0_8_;
    auVar52 = vfmadd231sd_fma(auVar50,auVar63,auVar58);
    auVar37._8_8_ = 0;
    auVar37._0_8_ = dVar44 * dVar6;
    auVar59 = vunpcklpd_avx(auVar37,auVar52);
    auVar38._8_8_ = 0;
    auVar38._0_8_ = dVar5 * in_XMM9_Qa * dVar7;
    auVar52 = vfnmadd231sd_fma(auVar38,auVar17._0_16_,auVar58);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = dVar7 * -dVar44;
    auVar3 = vunpcklpd_avx(auVar52,auVar27);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar44 * auVar17._0_8_;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = dVar5 * dVar44;
    auVar52 = vunpcklpd_avx(auVar9,auVar39);
    break;
  case CARDANO:
    dVar7 = cos(mangles->m_data[0]);
    dVar5 = cos(mangles->m_data[1]);
    dVar6 = cos(mangles->m_data[2]);
    local_68._0_8_ = sin(mangles->m_data[0]);
    local_68._8_8_ = extraout_XMM0_Qb_01;
    local_78._0_8_ = sin(mangles->m_data[1]);
    local_78._8_8_ = extraout_XMM0_Qb_02;
    auVar20._0_8_ = sin(mangles->m_data[2]);
    auVar20._8_56_ = extraout_var_02;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = dVar7;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = dVar6;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = (double)local_78._0_8_ * (double)local_68._0_8_ * auVar20._0_8_;
    auVar52 = vfmsub231sd_fma(auVar33,auVar56,auVar66);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = dVar5 * -(double)local_68._0_8_;
    auVar23 = vunpcklpd_avx(auVar52,auVar26);
    auVar34._8_8_ = 0;
    auVar34._0_8_ = dVar6 * (double)local_68._0_8_ * (double)local_78._0_8_;
    auVar52 = vfmadd231sd_fma(auVar34,auVar56,auVar20._0_16_);
    auVar57._8_8_ = 0;
    auVar57._0_8_ = dVar7 * (double)local_78._0_8_ * auVar20._0_8_;
    auVar3 = vfmadd231sd_fma(auVar57,local_68,auVar66);
    auVar59 = vunpcklpd_avx(auVar52,auVar3);
    auVar48._8_8_ = 0;
    auVar48._0_8_ = dVar6 * dVar7 * (double)local_78._0_8_;
    auVar52 = vfmsub231sd_fma(auVar48,local_68,auVar20._0_16_);
    auVar35._8_8_ = 0;
    auVar35._0_8_ = dVar5 * dVar7;
    auVar3 = vunpcklpd_avx(auVar35,auVar52);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar5 * -auVar20._0_8_;
    auVar52 = vunpcklpd_avx(auVar12,local_78);
    in_XMM9_Qa = dVar5 * dVar6;
    break;
  case HPB:
    dVar7 = cos(mangles->m_data[1]);
    dVar5 = cos(mangles->m_data[0]);
    dVar6 = cos(mangles->m_data[2]);
    dVar44 = sin(mangles->m_data[1]);
    dVar4 = sin(mangles->m_data[0]);
    auVar18._0_8_ = sin(mangles->m_data[2]);
    auVar18._8_56_ = extraout_var_00;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = dVar4;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = dVar5;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = dVar6;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar4 * dVar44 * auVar18._0_8_;
    auVar52 = vfmsub231sd_fma(auVar24,auVar28,auVar65);
    auVar29._8_8_ = 0;
    auVar29._0_8_ = dVar4 * dVar6 * dVar44;
    auVar3 = vfnmsub231sd_fma(auVar29,auVar18._0_16_,auVar65);
    auVar23 = vunpcklpd_avx(auVar52,auVar3);
    auVar53._8_8_ = 0;
    auVar53._0_8_ = dVar4 * -dVar7;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = dVar7 * auVar18._0_8_;
    auVar59 = vunpcklpd_avx(auVar53,auVar60);
    auVar30._0_8_ = -dVar44;
    auVar30._8_8_ = extraout_XMM0_Qb ^ 0x8000000000000000;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = dVar6 * dVar7;
    auVar3 = vunpcklpd_avx(auVar54,auVar30);
    auVar40._8_8_ = 0;
    auVar40._0_8_ = dVar5 * dVar44 * auVar18._0_8_;
    auVar52 = vfmadd231sd_fma(auVar40,auVar73,auVar28);
    auVar45._8_8_ = 0;
    auVar45._0_8_ = dVar5 * dVar6 * dVar44;
    auVar64 = vfnmadd231sd_fma(auVar45,auVar18._0_16_,auVar73);
    auVar52 = vunpcklpd_avx(auVar52,auVar64);
    goto LAB_004f3705;
  case RXYZ:
    dVar7 = cos(mangles->m_data[0]);
    dVar5 = cos(mangles->m_data[1]);
    dVar6 = cos(mangles->m_data[2]);
    dVar44 = sin(mangles->m_data[0]);
    local_78._0_8_ = sin(mangles->m_data[1]);
    local_78._8_8_ = extraout_XMM0_Qb_00;
    auVar19._0_8_ = sin(mangles->m_data[2]);
    auVar19._8_56_ = extraout_var_01;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = dVar6;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = dVar6 * dVar5;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = dVar5 * auVar19._0_8_;
    auVar23 = vunpcklpd_avx(auVar25,auVar31);
    auVar1._8_8_ = 0x8000000000000000;
    auVar1._0_8_ = 0x8000000000000000;
    auVar3 = vxorpd_avx512vl(local_78,auVar1);
    auVar41._8_8_ = 0;
    auVar41._0_8_ = dVar44 * (double)local_78._0_8_;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = auVar19._0_8_ * dVar7;
    auVar52 = vfmsub231sd_fma(auVar46,auVar41,auVar69);
    auVar59 = vunpcklpd_avx(auVar3,auVar52);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = dVar6 * dVar7;
    auVar52 = vfmadd231sd_fma(auVar32,auVar19._0_16_,auVar41);
    auVar42._8_8_ = 0;
    auVar42._0_8_ = dVar5 * dVar44;
    auVar3 = vunpcklpd_avx(auVar52,auVar42);
    auVar43._8_8_ = 0;
    auVar43._0_8_ = dVar7 * (double)local_78._0_8_;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = dVar44 * auVar19._0_8_;
    auVar52 = vfmadd231sd_fma(auVar47,auVar43,auVar69);
    auVar55._8_8_ = 0;
    auVar55._0_8_ = dVar6 * dVar44;
    auVar64 = vfmsub231sd_fma(auVar55,auVar43,auVar19._0_16_);
    auVar52 = vunpcklpd_avx(auVar52,auVar64);
LAB_004f3705:
    in_XMM9_Qa = dVar5 * dVar7;
    break;
  case RODRIGUEZ:
    dVar7 = mangles->m_data[0];
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar7;
    dVar5 = mangles->m_data[1];
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar5;
    dVar7 = dVar7 * dVar7;
    dVar5 = dVar5 * dVar5;
    dVar6 = mangles->m_data[2];
    auVar51._8_8_ = 0;
    auVar51._0_8_ = dVar6;
    dVar6 = dVar6 * dVar6;
    auVar52 = vfmsub213sd_fma(auVar22,auVar10,auVar51);
    auVar64._8_8_ = 0;
    auVar64._0_8_ = ((dVar7 + 1.0) - dVar5) - dVar6;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = auVar52._0_8_ + auVar52._0_8_;
    auVar52 = vunpcklpd_avx(auVar64,auVar67);
    auVar3 = vfmadd213sd_fma(auVar51,auVar10,auVar22);
    auVar59 = vfmadd213sd_fma(auVar22,auVar10,auVar51);
    auVar68._8_8_ = 0;
    auVar68._0_8_ = auVar3._0_8_ + auVar3._0_8_;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = auVar59._0_8_ + auVar59._0_8_;
    auVar3 = vunpcklpd_avx(auVar68,auVar71);
    auVar59 = vfmsub213sd_fma(auVar51,auVar22,auVar10);
    auVar72._8_8_ = 0;
    auVar72._0_8_ = ((1.0 - dVar7) + dVar5) - dVar6;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = auVar59._0_8_ + auVar59._0_8_;
    auVar64 = vunpcklpd_avx(auVar72,auVar75);
    auVar23 = vfmsub213sd_fma(auVar51,auVar10,auVar22);
    auVar59 = vfmadd213sd_fma(auVar51,auVar22,auVar10);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = auVar59._0_8_ + auVar59._0_8_;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = auVar23._0_8_ + auVar23._0_8_;
    auVar10 = vunpcklpd_avx(auVar76,auVar11);
    dVar44 = 1.0 / (dVar7 + dVar5 + dVar6 + 1.0);
    auVar23._0_8_ = auVar52._0_8_ * dVar44;
    auVar23._8_8_ = auVar52._8_8_ * dVar44;
    auVar59._0_8_ = auVar3._0_8_ * dVar44;
    auVar59._8_8_ = auVar3._8_8_ * dVar44;
    auVar3._0_8_ = auVar64._0_8_ * dVar44;
    auVar3._8_8_ = auVar64._8_8_ * dVar44;
    auVar52._0_8_ = auVar10._0_8_ * dVar44;
    auVar52._8_8_ = auVar10._8_8_ * dVar44;
    in_XMM9_Qa = (((1.0 - dVar7) - dVar5) + dVar6) * dVar44;
  }
  dVar5 = auVar59._0_8_;
  dVar4 = auVar52._0_8_;
  auVar64 = vshufpd_avx(auVar23,auVar23,1);
  dVar61 = auVar64._0_8_;
  auVar59 = vshufpd_avx(auVar59,auVar59,1);
  dVar62 = auVar59._0_8_;
  auVar59 = vshufpd_avx(auVar3,auVar3,1);
  dVar70 = auVar59._0_8_;
  auVar52 = vshufpd_avx(auVar52,auVar52,1);
  dVar74 = auVar52._0_8_;
  dVar6 = auVar23._0_8_;
  dVar44 = auVar3._0_8_;
  dVar7 = in_XMM9_Qa + dVar44 + dVar6;
  if (0.0 <= dVar7) {
    dVar7 = dVar7 + 1.0;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar7;
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
    }
    else {
      auVar52 = vsqrtsd_avx(auVar13,auVar13);
      dVar7 = auVar52._0_8_;
    }
    dVar8 = dVar7 * 0.5;
    dVar7 = 0.5 / dVar7;
    dVar6 = (dVar74 - dVar70) * dVar7;
    dVar44 = (dVar5 - dVar4) * dVar7;
    dVar7 = (dVar62 - dVar61) * dVar7;
  }
  else {
    cVar2 = dVar6 < dVar44;
    dVar7 = dVar6;
    if ((bool)cVar2) {
      dVar7 = dVar44;
    }
    if (dVar7 < in_XMM9_Qa) {
      cVar2 = '\x02';
    }
    if (cVar2 == '\x02') {
      dVar7 = ((in_XMM9_Qa - dVar6) - dVar44) + 1.0;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = dVar7;
      if (dVar7 < 0.0) {
        dVar8 = sqrt(dVar7);
      }
      else {
        auVar52 = vsqrtsd_avx(auVar15,auVar15);
        dVar8 = auVar52._0_8_;
      }
      dVar7 = dVar8 * 0.5;
      dVar8 = 0.5 / dVar8;
      dVar6 = (dVar4 + dVar5) * dVar8;
      dVar44 = (dVar74 + dVar70) * dVar8;
      dVar5 = dVar62 - dVar61;
    }
    else if (cVar2 == '\x01') {
      dVar7 = ((dVar44 - in_XMM9_Qa) - dVar6) + 1.0;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = dVar7;
      if (dVar7 < 0.0) {
        dVar8 = sqrt(dVar7);
      }
      else {
        auVar52 = vsqrtsd_avx(auVar14,auVar14);
        dVar8 = auVar52._0_8_;
      }
      dVar44 = dVar8 * 0.5;
      dVar8 = 0.5 / dVar8;
      dVar7 = (dVar74 + dVar70) * dVar8;
      dVar6 = (dVar62 + dVar61) * dVar8;
      dVar5 = dVar5 - dVar4;
    }
    else {
      dVar7 = ((dVar6 - dVar44) - in_XMM9_Qa) + 1.0;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = dVar7;
      if (dVar7 < 0.0) {
        dVar8 = sqrt(dVar7);
      }
      else {
        auVar52 = vsqrtsd_avx(auVar16,auVar16);
        dVar8 = auVar52._0_8_;
      }
      dVar6 = dVar8 * 0.5;
      dVar8 = 0.5 / dVar8;
      dVar44 = (dVar62 + dVar61) * dVar8;
      dVar7 = (dVar4 + dVar5) * dVar8;
      dVar5 = dVar74 - dVar70;
    }
    dVar8 = dVar5 * dVar8;
  }
  __return_storage_ptr__->m_data[0] = dVar8;
  __return_storage_ptr__->m_data[1] = dVar6;
  __return_storage_ptr__->m_data[2] = dVar44;
  __return_storage_ptr__->m_data[3] = dVar7;
  return __return_storage_ptr__;
}

Assistant:

ChQuaternion<double> Angle_to_Quat(AngleSet angset, const ChVector<double>& mangles) {
    ChQuaternion<double> res;
    ChMatrix33<> Acoord;

    switch (angset) {
        case AngleSet::EULERO:
            Acoord.Set_A_Eulero(mangles);
            break;
        case AngleSet::CARDANO:
            Acoord.Set_A_Cardano(mangles);
            break;
        case AngleSet::HPB:
            Acoord.Set_A_Hpb(mangles);
            break;
        case AngleSet::RXYZ:
            Acoord.Set_A_Rxyz(mangles);
            break;
        case AngleSet::RODRIGUEZ:
            Acoord.Set_A_Rodriguez(mangles);
            break;
        default:
            break;
    }
    res = Acoord.Get_A_quaternion();
    return res;
}